

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O3

void __thiscall
cinatra::coro_http_response::set_status_and_content_view<std::__cxx11::string>
          (coro_http_response *this,status_type status,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content,
          content_encoding encoding,bool is_view,string_view client_encoding_type)

{
  uchar *puVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  undefined7 in_register_00000009;
  string *str_dest;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string_view str_src;
  string encode_str;
  string local_4128;
  string local_4108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40c8;
  pointer local_40a8;
  undefined4 local_40a0;
  uchar *local_4090;
  int local_4088;
  undefined8 local_4068;
  undefined8 uStack_4060;
  undefined8 local_4058;
  uchar out [16384];
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000014,encoding);
  str_dest = (string *)CONCAT71(in_register_00000009,is_view);
  this->status_ = status;
  if ((int)str_dest == 1) {
    if (content._M_dataplus._M_p != (pointer)0x0) {
      str_dest = (string *)0x7;
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&content,"deflate",0,7)
      ;
      if (sVar6 == 0xffffffffffffffff) goto LAB_001ad4bc;
    }
    puVar1 = out + 0x10;
    out[8] = '\0';
    out[9] = '\0';
    out[10] = '\0';
    out[0xb] = '\0';
    out[0xc] = '\0';
    out[0xd] = '\0';
    out[0xe] = '\0';
    out[0xf] = '\0';
    out[0x10] = '\0';
    str_src._M_str = (char *)out;
    str_src._M_len = (size_t)(__str->_M_dataplus)._M_p;
    out._0_8_ = puVar1;
    bVar4 = gzip_codec::deflate((gzip_codec *)__str->_M_string_length,str_src,str_dest);
    if (bVar4) {
      add_header<char_const*,char_const*>(this,"Content-Encoding","deflate");
      paVar9 = &local_40e8.field_2;
      if ((uchar *)out._0_8_ == puVar1) {
        local_40e8.field_2._M_local_buf[8] = out[0x18];
        local_40e8.field_2._M_local_buf[9] = out[0x19];
        local_40e8.field_2._M_local_buf[10] = out[0x1a];
        local_40e8.field_2._M_local_buf[0xb] = out[0x1b];
        local_40e8.field_2._M_local_buf[0xc] = out[0x1c];
        local_40e8.field_2._M_local_buf[0xd] = out[0x1d];
        local_40e8.field_2._M_local_buf[0xe] = out[0x1e];
        local_40e8.field_2._M_local_buf[0xf] = out[0x1f];
        local_40e8._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_40e8._M_dataplus._M_p = (pointer)out._0_8_;
      }
      local_40e8.field_2._M_local_buf[1] = out[0x11];
      local_40e8.field_2._M_local_buf[2] = out[0x12];
      local_40e8.field_2._M_local_buf[3] = out[0x13];
      local_40e8.field_2._M_local_buf[4] = out[0x14];
      local_40e8.field_2._M_local_buf[5] = out[0x15];
      local_40e8.field_2._M_local_buf[6] = out[0x16];
      local_40e8.field_2._M_local_buf[7] = out[0x17];
      local_40e8.field_2._M_local_buf[0] = out[0x10];
      local_40e8._M_string_length._0_1_ = out[8];
      local_40e8._M_string_length._1_1_ = out[9];
      local_40e8._M_string_length._2_1_ = out[10];
      local_40e8._M_string_length._3_1_ = out[0xb];
      local_40e8._M_string_length._4_1_ = out[0xc];
      local_40e8._M_string_length._5_1_ = out[0xd];
      local_40e8._M_string_length._6_1_ = out[0xe];
      local_40e8._M_string_length._7_1_ = out[0xf];
      out[8] = '\0';
      out[9] = '\0';
      out[10] = '\0';
      out[0xb] = '\0';
      out[0xc] = '\0';
      out[0xd] = '\0';
      out[0xe] = '\0';
      out[0xf] = '\0';
      out[0x10] = '\0';
      out._0_8_ = puVar1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->content_,&local_40e8);
      this->has_set_content_ = true;
      _Var8._M_p = local_40e8._M_dataplus._M_p;
    }
    else {
      paVar9 = &local_4128.field_2;
      local_4128._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4128,"deflate compress error","");
      set_status_and_content
                (this,internal_server_error,&local_4128,none,
                 (string_view)(ZEXT816(0x2d02fd) << 0x40));
      _Var8._M_p = local_4128._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar9) {
      operator_delete(_Var8._M_p,paVar9->_M_allocated_capacity + 1);
    }
    if ((uchar *)out._0_8_ == puVar1) goto LAB_001ad4d6;
    lVar7 = CONCAT71(out._17_7_,out[0x10]);
    _Var8._M_p = (pointer)out._0_8_;
  }
  else {
    if ((int)str_dest != 0) {
LAB_001ad4bc:
      if ((char)client_encoding_type._M_len == '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&this->content_,__str);
      }
      else {
        pcVar2 = (__str->_M_dataplus)._M_p;
        (this->content_view_)._M_len = __str->_M_string_length;
        (this->content_view_)._M_str = pcVar2;
      }
      goto LAB_001ad4d6;
    }
    if (content._M_dataplus._M_p != (pointer)0x0) {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)&content,"gzip",0,4);
      if (sVar6 == 0xffffffffffffffff) goto LAB_001ad4bc;
    }
    paVar9 = &encode_str.field_2;
    encode_str._M_string_length = 0;
    encode_str.field_2._M_local_buf[0] = '\0';
    pcVar2 = (__str->_M_dataplus)._M_p;
    sVar3 = __str->_M_string_length;
    local_4058 = 0;
    local_4068 = 0;
    uStack_4060 = 0;
    encode_str._M_dataplus._M_p = (pointer)paVar9;
    iVar5 = deflateInit2_(&local_40a8,0xffffffff,8,0x1f,8,0,"1.2.11",0x70);
    if (iVar5 == 0) {
      local_40a0 = (undefined4)sVar3;
      local_40a8 = pcVar2;
      do {
        local_4088 = 0x4000;
        local_4090 = out;
        iVar5 = deflate(&local_40a8,4);
        if (iVar5 == -2) goto LAB_001ad37f;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&encode_str,(char *)out,(long)(0x4000 - local_4088));
      } while (local_4088 == 0);
      iVar5 = deflateEnd(&local_40a8);
      if (iVar5 != 0) goto LAB_001ad37f;
      add_header<char_const*,char_const*>(this,"Content-Encoding","gzip");
      paVar10 = &local_40c8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)encode_str._M_dataplus._M_p == paVar9) {
        local_40c8.field_2._8_8_ = encode_str.field_2._8_8_;
        local_40c8._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_40c8._M_dataplus._M_p = encode_str._M_dataplus._M_p;
      }
      local_40c8.field_2._M_allocated_capacity._1_7_ =
           encode_str.field_2._M_allocated_capacity._1_7_;
      local_40c8.field_2._M_local_buf[0] = encode_str.field_2._M_local_buf[0];
      local_40c8._M_string_length = encode_str._M_string_length;
      encode_str._M_string_length = 0;
      encode_str.field_2._M_local_buf[0] = '\0';
      encode_str._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->content_,&local_40c8);
      this->has_set_content_ = true;
      _Var8._M_p = local_40c8._M_dataplus._M_p;
    }
    else {
LAB_001ad37f:
      paVar10 = &local_4108.field_2;
      local_4108._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4108,"gzip compress error","");
      set_status_and_content
                (this,internal_server_error,&local_4108,none,
                 (string_view)(ZEXT816(0x2d02fd) << 0x40));
      _Var8._M_p = local_4108._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar10) {
      operator_delete(_Var8._M_p,paVar10->_M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)encode_str._M_dataplus._M_p == paVar9) goto LAB_001ad4d6;
    lVar7 = CONCAT71(encode_str.field_2._M_allocated_capacity._1_7_,
                     encode_str.field_2._M_local_buf[0]);
    _Var8._M_p = encode_str._M_dataplus._M_p;
  }
  operator_delete(_Var8._M_p,lVar7 + 1);
LAB_001ad4d6:
  this->has_set_content_ = true;
  return;
}

Assistant:

void set_status_and_content_view(
      status_type status, String content = "",
      content_encoding encoding = content_encoding::none, bool is_view = true,
      std::string_view client_encoding_type = "") {
    status_ = status;
#ifdef CINATRA_ENABLE_GZIP
    if (encoding == content_encoding::gzip) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("gzip") != std::string_view::npos) {
        std::string encode_str;
        bool r = gzip_codec::compress(content, encode_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "gzip compress error");
        }
        else {
          add_header("Content-Encoding", "gzip");
          set_content(std::move(encode_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }

    if (encoding == content_encoding::deflate) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("deflate") != std::string_view::npos) {
        std::string deflate_str;
        bool r = gzip_codec::deflate(content, deflate_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "deflate compress error");
        }
        else {
          add_header("Content-Encoding", "deflate");
          set_content(std::move(deflate_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }
#endif

#ifdef CINATRA_ENABLE_BROTLI
    if (encoding == content_encoding::br) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("br") != std::string_view::npos) {
        std::string br_str;
        bool r = br_codec::brotli_compress(content, br_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "br compress error");
        }
        else {
          add_header("Content-Encoding", "br");
          set_content(std::move(br_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }
#endif

    if (is_view) {
      content_view_ = content;
    }
    else {
      content_ = std::move(content);
    }
    has_set_content_ = true;
  }